

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dispatchkit.hpp
# Opt level: O3

void __thiscall
chaiscript::detail::Dispatch_Engine::save_function_params
          (Dispatch_Engine *this,
          vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_> *t_params)

{
  value_type *pvVar1;
  pointer pvVar2;
  _Map_base<const_void_*,_std::pair<const_void_*const,_chaiscript::detail::Stack_Holder>,_std::allocator<std::pair<const_void_*const,_chaiscript::detail::Stack_Holder>_>,_std::__detail::_Select1st,_std::equal_to<const_void_*>,_std::hash<const_void_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
  *this_00;
  mapped_type *pmVar3;
  Boxed_Value *param;
  value_type *__v;
  Thread_Storage<chaiscript::detail::Stack_Holder> *local_20;
  
  this_00 = (_Map_base<const_void_*,_std::pair<const_void_*const,_chaiscript::detail::Stack_Holder>,_std::allocator<std::pair<const_void_*const,_chaiscript::detail::Stack_Holder>_>,_std::__detail::_Select1st,_std::equal_to<const_void_*>,_std::hash<const_void_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             *)threading::Thread_Storage<chaiscript::detail::Stack_Holder>::t();
  local_20 = &this->m_stack_holder;
  pmVar3 = std::__detail::
           _Map_base<const_void_*,_std::pair<const_void_*const,_chaiscript::detail::Stack_Holder>,_std::allocator<std::pair<const_void_*const,_chaiscript::detail::Stack_Holder>_>,_std::__detail::_Select1st,_std::equal_to<const_void_*>,_std::hash<const_void_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::operator[](this_00,&local_20);
  pvVar1 = (t_params->
           super__Vector_base<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>).
           _M_impl.super__Vector_impl_data._M_finish;
  for (__v = (t_params->
             super__Vector_base<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>).
             _M_impl.super__Vector_impl_data._M_start; __v != pvVar1; __v = __v + 1) {
    pvVar2 = (pmVar3->call_params).
             super__Vector_base<std::vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>,_std::allocator<std::vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    std::vector<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>::_M_insert_rval
              (pvVar2 + -1,
               pvVar2[-1].
               super__Vector_base<chaiscript::Boxed_Value,_std::allocator<chaiscript::Boxed_Value>_>
               ._M_impl.super__Vector_impl_data._M_start,__v);
  }
  return;
}

Assistant:

void save_function_params(std::vector<Boxed_Value> &&t_params) { save_function_params(*m_stack_holder, std::move(t_params)); }